

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

bool __thiscall google::protobuf::safe_strto64(protobuf *this,StringPiece str,int64 *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  StringPiece str_local;
  
  str_local.ptr_ = str.ptr_;
  local_48 = (undefined1  [8])this;
  StringPiece::ToString_abi_cxx11_((string *)&str_local.length_,(StringPiece *)local_48);
  bVar1 = safe_strto64((string *)&str_local.length_,(int64 *)str.length_);
  std::__cxx11::string::~string((string *)&str_local.length_);
  return bVar1;
}

Assistant:

inline bool safe_strto64(StringPiece str, int64* value) {
  return safe_strto64(str.ToString(), value);
}